

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * tToDate_abi_cxx11_(int32_t t_s)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  tm *__tp;
  int in_ESI;
  string *in_RDI;
  tm *tm;
  time_t t;
  char buf [256];
  allocator<char> *in_stack_fffffffffffffed0;
  char local_118 [280];
  
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(long)in_ESI;
  __tp = localtime((time_t *)&stack0xfffffffffffffee0);
  strftime(local_118,0x100,"%A, %B %d",__tp);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__tp,in_stack_fffffffffffffed0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffed7);
  return in_RDI;
}

Assistant:

std::string tToDate(int32_t t_s) {
    char buf[256];
    time_t t = t_s;
    struct tm *tm = localtime(&t);
    strftime(buf, sizeof(buf), "%A, %B %d", tm);
    return buf;
}